

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializeToArray(MessageLite *this,void *data,int size)

{
  bool bVar1;
  uint uVar2;
  LogMessage *pLVar3;
  MessageLite *message;
  LogFinisher local_92;
  byte local_91;
  string local_90;
  byte local_59;
  LogMessage local_58;
  int local_1c;
  void *pvStack_18;
  int size_local;
  void *data_local;
  MessageLite *this_local;
  
  local_1c = size;
  pvStack_18 = data;
  data_local = this;
  uVar2 = (*this->_vptr_MessageLite[6])();
  local_59 = 0;
  local_91 = 0;
  if ((uVar2 & 1) == 0) {
    message = (MessageLite *)0x1e0;
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,"third_party/protobuf-lite/message_lite.cc",0x1e0);
    local_59 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_58,"CHECK failed: IsInitialized(): ");
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)"serialize",(char *)this,message);
    local_91 = 1;
    pLVar3 = internal::LogMessage::operator<<(pLVar3,&local_90);
    internal::LogFinisher::operator=(&local_92,pLVar3);
  }
  if ((local_91 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  bVar1 = SerializePartialToArray(this,pvStack_18,local_1c);
  return bVar1;
}

Assistant:

bool MessageLite::SerializeToArray(void* data, int size) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return SerializePartialToArray(data, size);
}